

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O2

AtomTypeSet * __thiscall
OpenMD::SelectionManager::getSelectedAtomTypes
          (AtomTypeSet *__return_storage_ptr__,SelectionManager *this)

{
  _Rb_tree_header *p_Var1;
  OpenMDBitSet *this_00;
  StuntDouble *pSVar2;
  bool bVar3;
  AtomType *in_RAX;
  size_t i;
  ulong uVar4;
  AtomType *local_28;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_28 = in_RAX;
  for (uVar4 = 0;
      this_00 = (this->ss_).bitsets_.
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)(this_00->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
              ((long)(this_00->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
              (long)(this_00->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      uVar4 = uVar4 + 1) {
    bVar3 = OpenMDBitSet::operator[](this_00,(int)uVar4);
    if (((bVar3) &&
        (pSVar2 = (this->stuntdoubles_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar4], pSVar2 != (StuntDouble *)0x0)) &&
       (pSVar2->objType_ < otRigidBody)) {
      local_28 = (AtomType *)pSVar2[1]._vptr_StuntDouble;
      std::
      _Rb_tree<OpenMD::AtomType*,OpenMD::AtomType*,std::_Identity<OpenMD::AtomType*>,OpenMD::AtomTypeCompare,std::allocator<OpenMD::AtomType*>>
      ::_M_insert_unique<OpenMD::AtomType*>
                ((_Rb_tree<OpenMD::AtomType*,OpenMD::AtomType*,std::_Identity<OpenMD::AtomType*>,OpenMD::AtomTypeCompare,std::allocator<OpenMD::AtomType*>>
                  *)__return_storage_ptr__,&local_28);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

AtomTypeSet SelectionManager::getSelectedAtomTypes() {
    AtomTypeSet atomTypes;

    for (size_t i = 0; i < ss_.bitsets_[STUNTDOUBLE].size(); ++i) {
      if (ss_.bitsets_[STUNTDOUBLE][i]) {
        // check that this processor owns this stuntdouble
        if (stuntdoubles_[i] != NULL) {
          if (stuntdoubles_[i]->isAtom()) {
            Atom* atom = static_cast<Atom*>(stuntdoubles_[i]);
            atomTypes.insert(atom->getAtomType());
          }
        }
      }
    }

#ifdef IS_MPI
    // loop over the found atom types on this processor, and add their
    // numerical idents to a vector:

    std::vector<int> foundTypes;
    AtomTypeSet::iterator i;
    for (i = atomTypes.begin(); i != atomTypes.end(); ++i)
      foundTypes.push_back((*i)->getIdent());

    // count_local holds the number of found types on this processor
    int count_local = foundTypes.size();

    int nproc;
    MPI_Comm_size(MPI_COMM_WORLD, &nproc);

    // we need arrays to hold the counts and displacement vectors for
    // all processors
    std::vector<int> counts(nproc, 0);
    std::vector<int> disps(nproc, 0);

    // fill the counts array
    MPI_Allgather(&count_local, 1, MPI_INT, &counts[0], 1, MPI_INT,
                  MPI_COMM_WORLD);

    // use the processor counts to compute the displacement array
    disps[0]       = 0;
    int totalCount = counts[0];
    for (int iproc = 1; iproc < nproc; iproc++) {
      disps[iproc] = disps[iproc - 1] + counts[iproc - 1];
      totalCount += counts[iproc];
    }

    if (totalCount > 0) {
      // we need a (possibly redundant) set of all found types:
      std::vector<int> ftGlobal(totalCount);

      // now spray out the foundTypes to all the other processors:
      MPI_Allgatherv(&foundTypes[0], count_local, MPI_INT, &ftGlobal[0],
                     &counts[0], &disps[0], MPI_INT, MPI_COMM_WORLD);

      std::vector<int>::iterator j;

      // foundIdents is a stl set, so inserting an already found ident
      // will have no effect.
      std::set<int> foundIdents;

      for (j = ftGlobal.begin(); j != ftGlobal.end(); ++j)
        foundIdents.insert((*j));

      // now iterate over the foundIdents and get the actual atom types
      // that correspond to these:
      ForceField* forceField_ = info_->getForceField();
      std::set<int>::iterator it;
      for (it = foundIdents.begin(); it != foundIdents.end(); ++it)
        atomTypes.insert(forceField_->getAtomType((*it)));
    }
#endif

    return atomTypes;
  }